

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.h
# Opt level: O2

int SetMotorSpeedIM483I(IM483I *pIM483I,int val)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  char *__s;
  int writebuflen;
  char recvbuf [512];
  char sendbuf [512];
  
  uVar1 = -val;
  if (0 < val) {
    uVar1 = val;
  }
  uVar4 = 0;
  if (((0x13 < uVar1) && (uVar4 = 20000, val < 0x4e21)) && (uVar4 = 0xffffb1e0, -20000 < val)) {
    uVar4 = val;
  }
  memset(sendbuf,0,0x200);
  sprintf(sendbuf,"M%d\r",(ulong)uVar4);
  sVar3 = strlen(sendbuf);
  writebuflen = (int)sVar3;
  iVar2 = WriteDataIM483I(pIM483I,(uint8 *)sendbuf,writebuflen,pIM483I->bytedelayus);
  iVar5 = 1;
  if (iVar2 == 0) {
    if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
      fwrite(sendbuf,(long)writebuflen,1,(FILE *)pIM483I->pfSaveFile);
      fflush((FILE *)pIM483I->pfSaveFile);
    }
    mSleep(0x14);
    if (pIM483I->bCheckState == 0) {
      return 0;
    }
    memset(recvbuf,0,0x200);
    iVar2 = ReadAllRS232Port(&pIM483I->RS232Port,(uint8 *)recvbuf,writebuflen + 1);
    if (iVar2 == 0) {
      if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
        fwrite(recvbuf,(long)(writebuflen + 1),1,(FILE *)pIM483I->pfSaveFile);
        fflush((FILE *)pIM483I->pfSaveFile);
      }
      iVar2 = strncmp(recvbuf,sendbuf,(long)writebuflen);
      iVar5 = 4;
      __s = "Error reading data from a IM483I : Invalid data. ";
      if ((iVar2 == 0) && (recvbuf[writebuflen] == '\n')) {
        return 0;
      }
    }
    else {
      __s = "Error reading data from a IM483I. ";
    }
  }
  else {
    __s = "Error writing data to a IM483I. ";
  }
  puts(__s);
  return iVar5;
}

Assistant:

inline int SetMotorSpeedIM483I(IM483I* pIM483I, int val)
{
	char sendbuf[MAX_NB_BYTES_IM483I];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_IM483I];
	int recvbuflen = 0;

	if (abs(val) < MIN_MOTOR_SPEED_IM483I) val = 0;
	else if (val > MAX_MOTOR_SPEED_IM483I) val = MAX_MOTOR_SPEED_IM483I;
	else if (val < -MAX_MOTOR_SPEED_IM483I) val = -MAX_MOTOR_SPEED_IM483I;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "M%d\r", val);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataIM483I(pIM483I, (unsigned char*)sendbuf, sendbuflen, pIM483I->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a IM483I. \n");
		return EXIT_FAILURE;
	}
	if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pIM483I->pfSaveFile);
		fflush(pIM483I->pfSaveFile);
	}

	mSleep(20);

	if (pIM483I->bCheckState)
	{
		// Should echo and add \n...

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = sendbuflen+1; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadAllRS232Port(&pIM483I->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Error reading data from a IM483I. \n");
			return EXIT_FAILURE;
		}
		if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pIM483I->pfSaveFile);
			fflush(pIM483I->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
		if ((strncmp(recvbuf, sendbuf, sendbuflen) != 0)||(recvbuf[recvbuflen-1] != '\n'))
		{
			printf("Error reading data from a IM483I : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
	}

	return EXIT_SUCCESS;
}